

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::TagAlias::TagAlias(TagAlias *this,string *_tag,SourceLineInfo _lineInfo)

{
  pointer pcVar1;
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  pcVar1 = (_tag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _tag->_M_string_length);
  (this->lineInfo).file = _lineInfo.file;
  (this->lineInfo).line = _lineInfo.line;
  return;
}

Assistant:

TagAlias::TagAlias(std::string const & _tag, SourceLineInfo _lineInfo): tag(_tag), lineInfo(_lineInfo) {}